

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O0

iterator cmList::Insert(container_type *container,const_iterator pos,string *value,
                       ExpandElements expandElements,EmptyElements emptyElements)

{
  iterator iVar1;
  undefined1 local_50 [8];
  string tmp;
  EmptyElements emptyElements_local;
  ExpandElements expandElements_local;
  string *value_local;
  container_type *container_local;
  const_iterator pos_local;
  
  tmp.field_2._8_4_ = emptyElements;
  tmp.field_2._12_4_ = expandElements;
  std::__cxx11::string::string((string *)local_50,(string *)value);
  iVar1 = Insert(container,pos,(string *)local_50,tmp.field_2._12_4_,tmp.field_2._8_4_);
  std::__cxx11::string::~string((string *)local_50);
  return (iterator)iVar1._M_current;
}

Assistant:

static container_type::iterator Insert(container_type& container,
                                         container_type::const_iterator pos,
                                         const std::string& value,
                                         ExpandElements expandElements,
                                         EmptyElements emptyElements)
  {
    auto tmp = value;
    return cmList::Insert(container, pos, std::move(tmp), expandElements,
                          emptyElements);
  }